

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashrate.cpp
# Opt level: O0

double __thiscall xmrig::Hashrate::calc(Hashrate *this,size_t threadId,size_t ms)

{
  long lVar1;
  long lVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double time;
  double hashes;
  uint64_t lastestHashCnt;
  uint64_t lastestStamp;
  size_t idx;
  size_t idx_start;
  uint64_t *counts;
  uint64_t *timestamps;
  uint64_t timeStampLimit;
  bool haveFullSet;
  uint64_t earliestStamp;
  uint64_t earliestHashCount;
  ulong local_60;
  long local_30;
  long local_28;
  double local_8;
  
  if (in_RSI < *in_RDI) {
    local_28 = 0;
    local_30 = 0;
    bVar7 = false;
    uVar3 = Chrono::highResolutionMSecs();
    lVar1 = *(long *)(in_RDI[3] + in_RSI * 8);
    lVar2 = *(long *)(in_RDI[2] + in_RSI * 8);
    uVar4 = (ulong)(*(int *)(in_RDI[1] + in_RSI * 4) - 1) & 0xfff;
    lVar6 = *(long *)(lVar1 + uVar4 * 8);
    local_60 = uVar4;
    do {
      if (*(ulong *)(lVar1 + local_60 * 8) < uVar3 - in_RDX) {
        bVar7 = *(long *)(lVar1 + local_60 * 8) != 0;
        if (local_60 != uVar4) {
          uVar5 = local_60 + 1 & 0xfff;
          local_30 = *(long *)(lVar1 + uVar5 * 8);
          local_28 = *(long *)(lVar2 + uVar5 * 8);
        }
        break;
      }
      local_60 = local_60 - 1 & 0xfff;
    } while (local_60 != uVar4);
    if (((bVar7) && (local_30 != 0)) && (lVar6 != 0)) {
      if (lVar6 == local_30) {
        local_8 = nan("");
      }
      else {
        local_28 = *(long *)(lVar2 + uVar4 * 8) - local_28;
        auVar8._8_4_ = (int)((ulong)local_28 >> 0x20);
        auVar8._0_8_ = local_28;
        auVar8._12_4_ = 0x45300000;
        lVar6 = lVar6 - local_30;
        auVar9._8_4_ = (int)((ulong)lVar6 >> 0x20);
        auVar9._0_8_ = lVar6;
        auVar9._12_4_ = 0x45300000;
        local_8 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_28) - 4503599627370496.0)) /
                  (((auVar9._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / 1000.0);
      }
    }
    else {
      local_8 = nan("");
    }
  }
  else {
    local_8 = nan("");
  }
  return local_8;
}

Assistant:

double xmrig::Hashrate::calc(size_t threadId, size_t ms) const
{
    assert(threadId < m_threads);
    if (threadId >= m_threads) {
        return nan("");
    }

    uint64_t earliestHashCount = 0;
    uint64_t earliestStamp     = 0;
    bool haveFullSet           = false;

    const uint64_t timeStampLimit = xmrig::Chrono::highResolutionMSecs() - ms;
    uint64_t* timestamps = m_timestamps[threadId];
    uint64_t* counts = m_counts[threadId];

    const size_t idx_start = (m_top[threadId] - 1) & kBucketMask;
    size_t idx = idx_start;

    uint64_t lastestStamp = timestamps[idx];
    uint64_t lastestHashCnt = counts[idx];

    do {
        if (timestamps[idx] < timeStampLimit) {
            haveFullSet = (timestamps[idx] != 0);
            if (idx != idx_start) {
                idx = (idx + 1) & kBucketMask;
                earliestStamp = timestamps[idx];
                earliestHashCount = counts[idx];
            }
            break;
        }
        idx = (idx - 1) & kBucketMask;
    } while (idx != idx_start);

    if (!haveFullSet || earliestStamp == 0 || lastestStamp == 0) {
        return nan("");
    }

    if (lastestStamp - earliestStamp == 0) {
        return nan("");
    }

    const auto hashes = static_cast<double>(lastestHashCnt - earliestHashCount);
    const auto time   = static_cast<double>(lastestStamp - earliestStamp) / 1000.0;

    return hashes / time;
}